

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_primitive_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::PrimitiveFieldGenerator::GenerateByteSize
          (PrimitiveFieldGenerator *this,Printer *printer)

{
  int iVar1;
  char *text;
  
  iVar1 = anon_unknown_3::FixedSize(*(Type *)(this->descriptor_ + 0x2c));
  text = "total_size += $tag_size$ + $fixed_size$;\n";
  if (iVar1 == -1) {
    text = 
    "total_size += $tag_size$ +\n  ::google::protobuf::internal::WireFormatLite::$declared_type$Size(\n    this->$name$());\n"
    ;
  }
  io::Printer::Print(printer,&this->variables_,text);
  return;
}

Assistant:

void PrimitiveFieldGenerator::
GenerateByteSize(io::Printer* printer) const {
  int fixed_size = FixedSize(descriptor_->type());
  if (fixed_size == -1) {
    printer->Print(variables_,
      "total_size += $tag_size$ +\n"
      "  ::google::protobuf::internal::WireFormatLite::$declared_type$Size(\n"
      "    this->$name$());\n");
  } else {
    printer->Print(variables_,
      "total_size += $tag_size$ + $fixed_size$;\n");
  }
}